

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O3

AssertionResult * __thiscall
iuutil::CmpHelperEqIterator<int*,int*>
          (AssertionResult *__return_storage_ptr__,iuutil *this,int *b1,int *e1,int *b2,int *e2)

{
  pointer pcVar1;
  int iVar2;
  iuStreamMessage *piVar3;
  AssertionResult *pAVar4;
  int *piVar5;
  bool bVar6;
  AssertionResult *pAVar7;
  bool bVar8;
  bool bVar9;
  Message ar;
  int local_3ac;
  ios_base *local_3a8;
  int *local_3a0;
  AssertionResult *local_398;
  iuutil *local_390;
  AssertionResult local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  AssertionResult local_340 [3];
  ios_base local_2c0 [264];
  undefined1 local_1b8 [392];
  
  local_398 = __return_storage_ptr__;
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1b8);
  local_3ac = 0;
  bVar8 = this != (iuutil *)b1;
  bVar9 = e1 != b2;
  local_3a0 = b2;
  local_390 = (iuutil *)b1;
  if (bVar8 && bVar9) {
    local_3a8 = local_2c0;
    bVar6 = true;
    do {
      iutest::internal::CmpHelperEQ<int,int>(&local_388,(internal *)0x16f1ca,"",(char *)this,e1,e2);
      iutest::AssertionResult::operator!(local_340,&local_388);
      bVar8 = local_340[0].m_result;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340[0].m_message._M_dataplus._M_p != &local_340[0].m_message.field_2) {
        operator_delete(local_340[0].m_message._M_dataplus._M_p,
                        CONCAT71(local_340[0].m_message.field_2._M_allocated_capacity._1_7_,
                                 local_340[0].m_message.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388.m_message._M_dataplus._M_p != &local_388.m_message.field_2) {
        operator_delete(local_388.m_message._M_dataplus._M_p,
                        local_388.m_message.field_2._M_allocated_capacity + 1);
      }
      if (bVar8 != false) {
        piVar3 = iutest::detail::iuStreamMessage::operator<<
                           ((iuStreamMessage *)local_1b8,(char (*) [25])"\nMismatch in a position ")
        ;
        piVar3 = iutest::detail::iuStreamMessage::operator<<(piVar3,&local_3ac);
        piVar3 = iutest::detail::iuStreamMessage::operator<<(piVar3,(char (*) [3])0x16ce2a);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_340);
        std::ostream::operator<<(&local_340[0].m_message.field_2,*(int *)this);
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
        std::ios_base::~ios_base(local_3a8);
        piVar3 = iutest::detail::iuStreamMessage::operator<<(piVar3,&local_388.m_message);
        piVar3 = iutest::detail::iuStreamMessage::operator<<(piVar3,(char (*) [5])" vs ");
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_340);
        std::ostream::operator<<(&local_340[0].m_message.field_2,*e1);
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
        std::ios_base::~ios_base(local_3a8);
        iutest::detail::iuStreamMessage::operator<<(piVar3,&local_360);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388.m_message._M_dataplus._M_p != &local_388.m_message.field_2) {
          operator_delete(local_388.m_message._M_dataplus._M_p,
                          local_388.m_message.field_2._M_allocated_capacity + 1);
        }
        bVar6 = false;
      }
      this = this + 4;
      e1 = e1 + 1;
      local_3ac = local_3ac + 1;
      bVar9 = e1 != local_3a0;
      bVar8 = this != local_390;
    } while ((bVar8) && (e1 != local_3a0));
  }
  else {
    bVar6 = true;
  }
  if (bVar8) {
    iVar2 = local_3ac;
    if (this != local_390) {
      iVar2 = local_3ac + (int)((ulong)(local_390 + (0x3fffffffc - (long)this)) >> 2) + 1;
    }
    local_340[0].m_message._M_dataplus._M_p._0_4_ = iVar2;
    piVar3 = iutest::detail::iuStreamMessage::operator<<
                       ((iuStreamMessage *)local_1b8,(char (*) [21])"\nMismatch element : ");
    piVar5 = local_3a0;
    piVar3 = iutest::detail::iuStreamMessage::operator<<(piVar3,(int *)local_340);
    piVar3 = iutest::detail::iuStreamMessage::operator<<(piVar3,(char (*) [5])" vs ");
    iutest::detail::iuStreamMessage::operator<<(piVar3,&local_3ac);
    if (bVar9) {
LAB_0016347d:
      iVar2 = local_3ac;
      if (e1 != piVar5) {
        iVar2 = local_3ac + (int)((ulong)((long)piVar5 + (0x3fffffffc - (long)e1)) >> 2) + 1;
      }
      local_340[0].m_message._M_dataplus._M_p._0_4_ = iVar2;
      piVar3 = iutest::detail::iuStreamMessage::operator<<
                         ((iuStreamMessage *)local_1b8,(char (*) [21])"\nMismatch element : ");
      piVar3 = iutest::detail::iuStreamMessage::operator<<(piVar3,&local_3ac);
      piVar3 = iutest::detail::iuStreamMessage::operator<<(piVar3,(char (*) [5])" vs ");
      iutest::detail::iuStreamMessage::operator<<(piVar3,(int *)local_340);
    }
  }
  else {
    piVar5 = local_3a0;
    if (bVar9) goto LAB_0016347d;
    if (bVar6) {
      (local_398->m_message)._M_dataplus._M_p = (pointer)&(local_398->m_message).field_2;
      (local_398->m_message)._M_string_length = 0;
      (local_398->m_message).field_2._M_local_buf[0] = '\0';
      local_398->m_result = true;
      pAVar7 = local_398;
      goto LAB_0016357e;
    }
  }
  local_340[0].m_message._M_dataplus._M_p = (pointer)&local_340[0].m_message.field_2;
  local_340[0].m_message._M_string_length = 0;
  local_340[0].m_message.field_2._M_local_buf[0] = '\0';
  local_340[0].m_result = false;
  pAVar4 = iutest::AssertionResult::operator<<(local_340,(iuStreamMessage *)local_1b8);
  pAVar7 = local_398;
  (local_398->m_message)._M_dataplus._M_p = (pointer)&(local_398->m_message).field_2;
  pcVar1 = (pAVar4->m_message)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_398,pcVar1,pcVar1 + (pAVar4->m_message)._M_string_length);
  pAVar7->m_result = pAVar4->m_result;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340[0].m_message._M_dataplus._M_p != &local_340[0].m_message.field_2) {
    operator_delete(local_340[0].m_message._M_dataplus._M_p,
                    CONCAT71(local_340[0].m_message.field_2._M_allocated_capacity._1_7_,
                             local_340[0].m_message.field_2._M_local_buf[0]) + 1);
  }
LAB_0016357e:
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  return pAVar7;
}

Assistant:

::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperEqIterator(T1 b1, T1 e1, T2 b2, T2 e2)
{
    int elem=0;
    bool result = true;
    ::iutest::Message ar;
    for(elem=0; b1 != e1 && b2 != e2; ++b1, ++b2, ++elem)
    {
        if(!::iutest::internal::backward::EqHelper<false>::Compare("", "", *b1, *b2))
        {
            result = false;
            ar << "\nMismatch in a position " << elem << ": "
                << ::iutest::internal::FormatForComparisonFailureMessage(*b1, *b2)
                << " vs " << ::iutest::internal::FormatForComparisonFailureMessage(*b2, *b1);
        }
    }
    if(b1 != e1)
    {
        int elem1 = elem;
        for(; b1 != e1; ++b1, ++elem1) {}
        result = false;
        ar << "\nMismatch element : " << elem1 << " vs " << elem;
    }
    if(b2 != e2)
    {
        int elem2 = elem;
        for(; b2 != e2; ++b2, ++elem2) {}
        result = false;
        ar << "\nMismatch element : " << elem << " vs " << elem2;
    }
    if( !result )
    {
        return ::iutest::AssertionFailure() << ar;
    }
    return ::iutest::AssertionSuccess();
}